

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O2

void PushInterval(CostManager *manager,int64_t distance_cost,int position,int len)

{
  int end;
  int end_00;
  CostCacheInterval *pCVar1;
  CostInterval *pCVar2;
  int64_t *piVar3;
  CostCacheInterval *pCVar4;
  int start_new;
  CostInterval *interval_in;
  ulong uVar5;
  uint16_t uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  
  if (len < 10) {
    piVar3 = manager->cost_cache;
    uVar6 = 1;
    for (lVar7 = (long)position; lVar7 < len + position; lVar7 = lVar7 + 1) {
      if (*piVar3 + distance_cost < manager->costs[lVar7]) {
        manager->costs[lVar7] = *piVar3 + distance_cost;
        manager->dist_array[lVar7] = uVar6;
      }
      uVar6 = uVar6 + 1;
      piVar3 = piVar3 + 1;
    }
  }
  else {
    pCVar1 = manager->cache_intervals;
    interval_in = manager->head;
    for (uVar5 = 0; uVar5 < manager->cache_intervals_size; uVar5 = uVar5 + 1) {
      iVar9 = pCVar1[uVar5].start;
      if (len <= iVar9) {
        return;
      }
      pCVar4 = pCVar1 + uVar5;
      iVar8 = pCVar4->end;
      if (len <= iVar8) {
        iVar8 = len;
      }
      iVar8 = iVar8 + position;
      lVar7 = pCVar4->cost + distance_cost;
      pCVar2 = interval_in;
      iVar9 = iVar9 + position;
      do {
        while( true ) {
          do {
            interval_in = pCVar2;
            if (interval_in == (CostInterval *)0x0) {
              interval_in = (CostInterval *)0x0;
              goto LAB_0016e4cd;
            }
            end = interval_in->start;
            if (iVar8 <= end) goto LAB_0016e4cd;
            pCVar2 = interval_in->next;
            end_00 = interval_in->end;
          } while (end_00 <= iVar9);
          if (interval_in->cost <= lVar7) break;
          if (end < iVar9) {
            if (iVar8 < end_00) {
              interval_in->end = iVar9;
              InsertInterval(manager,interval_in,interval_in->cost,interval_in->index,iVar8,end_00);
              interval_in = interval_in->next;
              goto LAB_0016e4cd;
            }
            interval_in->end = iVar9;
          }
          else {
            if (iVar8 < end_00) {
              interval_in->start = iVar8;
              goto LAB_0016e4cd;
            }
            PopInterval(manager,interval_in);
          }
        }
        InsertInterval(manager,interval_in,lVar7,position,iVar9,end);
        iVar9 = end_00;
      } while (end_00 < iVar8);
LAB_0016e4cd:
      InsertInterval(manager,interval_in,lVar7,position,iVar9,iVar8);
    }
  }
  return;
}

Assistant:

static WEBP_INLINE void PushInterval(CostManager* const manager,
                                     int64_t distance_cost, int position,
                                     int len) {
  size_t i;
  CostInterval* interval = manager->head;
  CostInterval* interval_next;
  const CostCacheInterval* const cost_cache_intervals =
      manager->cache_intervals;
  // If the interval is small enough, no need to deal with the heavy
  // interval logic, just serialize it right away. This constant is empirical.
  const int kSkipDistance = 10;

  if (len < kSkipDistance) {
    int j;
    for (j = position; j < position + len; ++j) {
      const int k = j - position;
      int64_t cost_tmp;
      assert(k >= 0 && k < MAX_LENGTH);
      cost_tmp = distance_cost + manager->cost_cache[k];

      if (manager->costs[j] > cost_tmp) {
        manager->costs[j] = cost_tmp;
        manager->dist_array[j] = k + 1;
      }
    }
    return;
  }

  for (i = 0; i < manager->cache_intervals_size &&
              cost_cache_intervals[i].start < len;
       ++i) {
    // Define the intersection of the ith interval with the new one.
    int start = position + cost_cache_intervals[i].start;
    const int end = position + (cost_cache_intervals[i].end > len
                                 ? len
                                 : cost_cache_intervals[i].end);
    const int64_t cost = distance_cost + cost_cache_intervals[i].cost;

    for (; interval != NULL && interval->start < end;
         interval = interval_next) {
      interval_next = interval->next;

      // Make sure we have some overlap
      if (start >= interval->end) continue;

      if (cost >= interval->cost) {
        // When intervals are represented, the lower, the better.
        // [**********************************************************[
        // start                                                    end
        //                   [----------------------------------[
        //                   interval->start        interval->end
        // If we are worse than what we already have, add whatever we have so
        // far up to interval.
        const int start_new = interval->end;
        InsertInterval(manager, interval, cost, position, start,
                       interval->start);
        start = start_new;
        if (start >= end) break;
        continue;
      }

      if (start <= interval->start) {
        if (interval->end <= end) {
          //                   [----------------------------------[
          //                   interval->start        interval->end
          // [**************************************************************[
          // start                                                        end
          // We can safely remove the old interval as it is fully included.
          PopInterval(manager, interval);
        } else {
          //              [------------------------------------[
          //              interval->start          interval->end
          // [*****************************[
          // start                       end
          interval->start = end;
          break;
        }
      } else {
        if (end < interval->end) {
          // [--------------------------------------------------------------[
          // interval->start                                    interval->end
          //                     [*****************************[
          //                     start                       end
          // We have to split the old interval as it fully contains the new one.
          const int end_original = interval->end;
          interval->end = start;
          InsertInterval(manager, interval, interval->cost, interval->index,
                         end, end_original);
          interval = interval->next;
          break;
        } else {
          // [------------------------------------[
          // interval->start          interval->end
          //                     [*****************************[
          //                     start                       end
          interval->end = start;
        }
      }
    }
    // Insert the remaining interval from start to end.
    InsertInterval(manager, interval, cost, position, start, end);
  }
}